

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver_service.hpp
# Opt level: O0

results_type * __thiscall
asio::detail::resolver_service<asio::ip::tcp>::resolve
          (results_type *__return_storage_ptr__,resolver_service<asio::ip::tcp> *this,
          implementation_type *param_1,query_type *qry,error_code *ec)

{
  bool bVar1;
  socket_ops *this_00;
  char *__name;
  addrinfo_type *paVar2;
  string local_e8;
  byte local_c1;
  string local_c0;
  auto_addrinfo local_a0;
  auto_addrinfo auto_address_info;
  string local_78;
  string local_58;
  addrinfo_type *local_38;
  addrinfo_type *address_info;
  error_code *ec_local;
  query_type *qry_local;
  implementation_type *param_1_local;
  resolver_service<asio::ip::tcp> *this_local;
  
  local_38 = (addrinfo_type *)0x0;
  address_info = (addrinfo_type *)ec;
  ec_local = (error_code *)qry;
  qry_local = (query_type *)param_1;
  param_1_local = (implementation_type *)this;
  this_local = (resolver_service<asio::ip::tcp> *)__return_storage_ptr__;
  ip::basic_resolver_query<asio::ip::tcp>::host_name_abi_cxx11_(&local_58,qry);
  this_00 = (socket_ops *)
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                      (&local_58);
  ip::basic_resolver_query<asio::ip::tcp>::service_name_abi_cxx11_
            (&local_78,(basic_resolver_query<asio::ip::tcp> *)ec_local);
  __name = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_78);
  paVar2 = ip::basic_resolver_query<asio::ip::tcp>::hints
                     ((basic_resolver_query<asio::ip::tcp> *)ec_local);
  auto_address_info.ai_._0_4_ =
       socket_ops::getaddrinfo
                 (this_00,__name,(char *)paVar2,(addrinfo *)&local_38,(addrinfo **)address_info);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  resolver_service_base::auto_addrinfo::auto_addrinfo(&local_a0,local_38);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)address_info);
  paVar2 = local_38;
  local_c1 = 0;
  if (bVar1) {
    ip::basic_resolver_results<asio::ip::tcp>::basic_resolver_results(__return_storage_ptr__);
  }
  else {
    ip::basic_resolver_query<asio::ip::tcp>::host_name_abi_cxx11_
              (&local_c0,(basic_resolver_query<asio::ip::tcp> *)ec_local);
    local_c1 = 1;
    ip::basic_resolver_query<asio::ip::tcp>::service_name_abi_cxx11_
              (&local_e8,(basic_resolver_query<asio::ip::tcp> *)ec_local);
    ip::basic_resolver_results<asio::ip::tcp>::create
              (__return_storage_ptr__,paVar2,&local_c0,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  if ((local_c1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c0);
  }
  resolver_service_base::auto_addrinfo::~auto_addrinfo(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

results_type resolve(implementation_type&, const query_type& qry,
      asio::error_code& ec)
  {
    asio::detail::addrinfo_type* address_info = 0;

    socket_ops::getaddrinfo(qry.host_name().c_str(),
        qry.service_name().c_str(), qry.hints(), &address_info, ec);
    auto_addrinfo auto_address_info(address_info);

    return ec ? results_type() : results_type::create(
        address_info, qry.host_name(), qry.service_name());
  }